

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

bool __thiscall Imath_3_2::Frustum<float>::operator==(Frustum<float> *this,Frustum<float> *src)

{
  bool local_11;
  Frustum<float> *src_local;
  Frustum<float> *this_local;
  
  local_11 = false;
  if ((this->_nearPlane == src->_nearPlane) && (!NAN(this->_nearPlane) && !NAN(src->_nearPlane))) {
    local_11 = false;
    if ((this->_farPlane == src->_farPlane) && (!NAN(this->_farPlane) && !NAN(src->_farPlane))) {
      local_11 = false;
      if ((this->_left == src->_left) && (!NAN(this->_left) && !NAN(src->_left))) {
        local_11 = false;
        if ((this->_right == src->_right) && (!NAN(this->_right) && !NAN(src->_right))) {
          local_11 = false;
          if ((this->_top == src->_top) && (!NAN(this->_top) && !NAN(src->_top))) {
            local_11 = false;
            if ((this->_bottom == src->_bottom) && (!NAN(this->_bottom) && !NAN(src->_bottom))) {
              local_11 = (this->_orthographic & 1U) == (src->_orthographic & 1U);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

constexpr inline bool
Frustum<T>::operator== (const Frustum<T>& src) const IMATH_NOEXCEPT
{
    return _nearPlane == src._nearPlane && _farPlane == src._farPlane &&
           _left == src._left && _right == src._right && _top == src._top &&
           _bottom == src._bottom && _orthographic == src._orthographic;
}